

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateExtension
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  undefined1 uVar1;
  undefined1 uVar2;
  CppType CVar3;
  CppType CVar4;
  Descriptor *pDVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  FieldDescriptor *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  pointer in_RSI;
  string extension_object_name;
  string extension_scope;
  char *pcVar6;
  int iVar7;
  Printer *this_00;
  AlphaNum *pAVar8;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  FieldDescriptor *this_01;
  FileDescriptor *in_stack_fffffffffffffbe0;
  GeneratorOptions *in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffbf8;
  FieldDescriptor *in_stack_fffffffffffffc00;
  GeneratorOptions *in_stack_fffffffffffffc08;
  FieldDescriptor *in_stack_fffffffffffffc10;
  string *from_file;
  GeneratorOptions *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  GeneratorOptions *in_stack_fffffffffffffc38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  pointer in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  Printer *in_stack_fffffffffffffc58;
  Printer *this_02;
  Printer *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  char (*in_stack_fffffffffffffc80) [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5;
  char (*in_stack_fffffffffffffc90) [14];
  pointer args_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  char (*args_2) [6];
  undefined7 in_stack_fffffffffffffca8;
  allocator *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbc;
  undefined1 in_stack_fffffffffffffcbd;
  undefined1 uVar11;
  undefined1 in_stack_fffffffffffffcbe;
  undefined1 uVar12;
  undefined1 in_stack_fffffffffffffcbf;
  undefined1 uVar13;
  Printer *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  char (*in_stack_fffffffffffffd00) [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  char (*in_stack_fffffffffffffd10) [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  char (*in_stack_fffffffffffffd20) [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  char (*in_stack_fffffffffffffd30) [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  char (*in_stack_fffffffffffffd40) [25];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  char (*in_stack_fffffffffffffd50) [27];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  undefined1 local_28a [34];
  string local_268 [38];
  allocator local_242;
  bool local_241;
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [80];
  string local_190 [32];
  string local_170 [37];
  byte local_14b;
  allocator local_14a;
  byte local_149;
  string local_148 [32];
  string local_128 [38];
  byte local_102;
  Printer local_101;
  string local_60 [32];
  undefined1 local_40 [48];
  pointer local_10;
  
  this_02 = (Printer *)&stack0xfffffffffffffbb8;
  local_40._32_8_ = in_RCX;
  local_40._40_8_ = in_RDX;
  local_10 = in_RSI;
  pDVar5 = FieldDescriptor::extension_scope(in_RCX);
  if (pDVar5 == (Descriptor *)0x0) {
    FieldDescriptor::file((FieldDescriptor *)local_40._32_8_);
    (anonymous_namespace)::GetNamespace_abi_cxx11_
              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  }
  else {
    FieldDescriptor::extension_scope((FieldDescriptor *)local_40._32_8_);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (in_stack_fffffffffffffc08,(Descriptor *)in_stack_fffffffffffffc00);
  }
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
            ((GeneratorOptions *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
             (FieldDescriptor *)in_stack_fffffffffffffcc0,(bool)in_stack_fffffffffffffcbf,
             (bool)in_stack_fffffffffffffcbe,(bool)in_stack_fffffffffffffcbd,
             (BytesMode)local_40._40_8_,(bool)in_stack_fffffffffffffcbc);
  pcVar9 = "extensionType";
  this_00 = (Printer *)local_40;
  pcVar6 = "class";
  io::Printer::
  Print<char[14],std::__cxx11::string,char[5],std::__cxx11::string,char[6],std::__cxx11::string,char[14],std::__cxx11::string>
            (in_stack_fffffffffffffc58,
             (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             (char (*) [14])in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
             (char (*) [5])in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
             in_stack_fffffffffffffc80,in_stack_fffffffffffffc88,in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc98);
  std::__cxx11::string::~string
            ((string *)
             ((long)&local_101.substitutions_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
             + 1));
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (this_00,pcVar6,(FieldDescriptor *)0x466e78);
  iVar7 = (int)((ulong)pcVar6 >> 0x20);
  FieldDescriptor::number((FieldDescriptor *)local_40._32_8_);
  strings::AlphaNum::AlphaNum((AlphaNum *)this_00,iVar7);
  StrCat_abi_cxx11_((AlphaNum *)in_stack_fffffffffffffbf8);
  local_102 = 0;
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x466ee2);
  if (CVar3 == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (in_stack_fffffffffffffc38,(FieldDescriptor *)in_stack_fffffffffffffc30);
  }
  else {
    in_stack_fffffffffffffcc0 = &local_101;
    std::allocator<char>::allocator();
    local_102 = 1;
    std::__cxx11::string::string
              ((string *)&local_101.field_0x1,"null",(allocator *)in_stack_fffffffffffffcc0);
  }
  local_149 = 0;
  local_14b = 0;
  CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)0x466f72);
  uVar2 = (undefined1)CVar4;
  uVar11 = (undefined1)(CVar4 >> 8);
  uVar12 = (undefined1)(CVar4 >> 0x10);
  uVar13 = (undefined1)(CVar4 >> 0x18);
  if (CVar4 == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (in_stack_fffffffffffffc38,(FieldDescriptor *)in_stack_fffffffffffffc30);
    local_149 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar9,
                   &this_00->variable_delimiter_);
  }
  else {
    in_stack_fffffffffffffcb0 = &local_14a;
    std::allocator<char>::allocator();
    local_14b = 1;
    std::__cxx11::string::string(local_128,"null",in_stack_fffffffffffffcb0);
  }
  uVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x467018);
  if ((bool)uVar1) {
    args_2 = (char (*) [6])0x76a2b4;
  }
  else {
    args_2 = (char (*) [6])0x7692f2;
  }
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x769a81;
  pAVar8 = (AlphaNum *)&local_101.field_0x1;
  iVar7 = 0;
  io::Printer::
  Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string,char[5],std::__cxx11::string,char[9],std::__cxx11::string,char[9],char[2]>
            ((Printer *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
             &in_stack_fffffffffffffc60->variable_delimiter_,
             &in_stack_fffffffffffffc58->variable_delimiter_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             (char (*) [5])in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,(char (*) [5])args_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffca8),(char (*) [9])in_stack_fffffffffffffcb0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar13,CONCAT16(uVar12,CONCAT15(uVar11,CONCAT14(uVar2,
                                                  in_stack_fffffffffffffcb8)))),
             &in_stack_fffffffffffffcc0->variable_delimiter_,
             (char (*) [2])CONCAT44(CVar3,in_stack_fffffffffffffcc8));
  std::__cxx11::string::~string(local_128);
  if ((local_14b & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_14a);
  }
  if ((local_149 & 1) != 0) {
    std::__cxx11::string::~string(local_148);
  }
  std::__cxx11::string::~string((string *)&local_101.field_0x1);
  if ((local_102 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  std::__cxx11::string::~string((string *)&local_101.substitutions_._M_t._M_impl.field_0x1);
  args_5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40._40_8_;
  args_6 = local_10;
  args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           FieldDescriptor::file((FieldDescriptor *)local_40._32_8_);
  pDVar5 = FieldDescriptor::containing_type((FieldDescriptor *)local_40._32_8_);
  (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
            (in_stack_fffffffffffffc18,(FileDescriptor *)in_stack_fffffffffffffc10,
             (Descriptor *)in_stack_fffffffffffffc08);
  FieldDescriptor::number((FieldDescriptor *)local_40._32_8_);
  strings::AlphaNum::AlphaNum(pAVar8,iVar7);
  StrCat_abi_cxx11_((AlphaNum *)in_stack_fffffffffffffbf8);
  (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  local_241 = false;
  local_268[0x25] = (string)0x0;
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x467250);
  if (CVar3 == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (in_stack_fffffffffffffc38,(FieldDescriptor *)in_stack_fffffffffffffc30);
    local_241 = true;
    std::operator+(pbVar10,(char *)pAVar8);
  }
  else {
    std::allocator<char>::allocator();
    local_268[0x25] = (string)0x1;
    std::__cxx11::string::string(local_220,"undefined",&local_242);
  }
  local_28a[1] = 0;
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x467306);
  if (CVar3 != CPPTYPE_MESSAGE) {
    in_stack_fffffffffffffc60 = (Printer *)local_28a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_268,"undefined",(allocator *)in_stack_fffffffffffffc60);
  }
  else {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (in_stack_fffffffffffffc38,(FieldDescriptor *)in_stack_fffffffffffffc30);
    local_28a[1] = 1;
    std::operator+(pbVar10,(char *)pAVar8);
  }
  from_file = local_268;
  pcVar9 = "binaryMessageDeserializeFn";
  pcVar6 = "binaryMessageSerializeFn";
  this_01 = (FieldDescriptor *)0x771c54;
  pAVar8 = (AlphaNum *)local_40;
  iVar7 = 0;
  io::Printer::
  Print<char[11],std::__cxx11::string,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[5],std::__cxx11::string,char[15],std::__cxx11::string,char[15],std::__cxx11::string,char[25],std::__cxx11::string,char[27],std::__cxx11::string>
            (in_stack_fffffffffffffcc0,
             (char *)CONCAT17(uVar13,CONCAT16(uVar12,CONCAT15(uVar11,CONCAT14(uVar2,
                                                  in_stack_fffffffffffffcb8)))),
             (char (*) [11])in_stack_fffffffffffffcb0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffca8),args_2,args_3,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffd08,in_stack_fffffffffffffd10,in_stack_fffffffffffffd18,
             in_stack_fffffffffffffd20,in_stack_fffffffffffffd28,in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd38,in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,
             in_stack_fffffffffffffd50,in_stack_fffffffffffffd58);
  std::__cxx11::string::~string(local_268);
  if (CVar3 != CPPTYPE_MESSAGE) {
    std::allocator<char>::~allocator((allocator<char> *)local_28a);
  }
  if ((local_28a[1] & 1) != 0) {
    std::__cxx11::string::~string((string *)(local_28a + 2));
  }
  std::__cxx11::string::~string(local_220);
  if (((byte)local_268[0x25] & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_242);
  }
  if ((local_241 & 1U) != 0) {
    std::__cxx11::string::~string(local_240);
  }
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_170);
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40._40_8_;
  uVar2 = FieldDescriptor::is_packed(this_01);
  io::Printer::Print<char[9],char_const*>
            (in_stack_fffffffffffffc60,&this_02->variable_delimiter_,
             (char (*) [9])CONCAT17(uVar2,in_stack_fffffffffffffc50),(char **)pbVar10);
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           FieldDescriptor::file((FieldDescriptor *)local_40._32_8_);
  FieldDescriptor::containing_type((FieldDescriptor *)local_40._32_8_);
  (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
            (in_stack_fffffffffffffc18,(FileDescriptor *)from_file,(Descriptor *)pcVar9);
  FieldDescriptor::number((FieldDescriptor *)local_40._32_8_);
  strings::AlphaNum::AlphaNum(pAVar8,iVar7);
  StrCat_abi_cxx11_((AlphaNum *)pcVar6);
  io::Printer::
  Print<char[11],std::__cxx11::string,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[5],std::__cxx11::string>
            (this_02,(char *)CONCAT17(uVar2,in_stack_fffffffffffffc50),(char (*) [11])pbVar10,args_1
             ,(char (*) [6])local_10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40._40_8_,
             (char (*) [6])pDVar5,args_5,(char (*) [5])args_6,args_3);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd28);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd48);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Generator::GenerateExtension(const GeneratorOptions& options,
                                  io::Printer* printer,
                                  const FieldDescriptor* field) const {
  std::string extension_scope =
      (field->extension_scope()
           ? GetMessagePath(options, field->extension_scope())
           : GetNamespace(options, field->file()));

  const std::string extension_object_name = JSObjectFieldName(options, field);
  printer->Print(
      "\n"
      "/**\n"
      " * A tuple of {field number, class constructor} for the extension\n"
      " * field named `$nameInComment$`.\n"
      " * @type {!jspb.ExtensionFieldInfo<$extensionType$>}\n"
      " */\n"
      "$class$.$name$ = new jspb.ExtensionFieldInfo(\n",
      "nameInComment", extension_object_name, "name", extension_object_name,
      "class", extension_scope, "extensionType",
      JSFieldTypeAnnotation(options, field,
                            /* is_setter_argument = */ false,
                            /* force_present = */ true,
                            /* singular_if_not_packed = */ false));
  printer->Annotate("name", field);
  printer->Print(
      "    $index$,\n"
      "    {$name$: 0},\n"
      "    $ctor$,\n"
      "     /** @type {?function((boolean|undefined),!jspb.Message=): "
      "!Object} */ (\n"
      "         $toObject$),\n"
      "    $repeated$);\n",
      "index", StrCat(field->number()), "name", extension_object_name,
      "ctor",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE
           ? SubmessageTypeRef(options, field)
           : std::string("null")),
      "toObject",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE
           ? (SubmessageTypeRef(options, field) + ".toObject")
           : std::string("null")),
      "repeated", (field->is_repeated() ? "1" : "0"));

  printer->Print(
      "\n"
      "$extendName$Binary[$index$] = new jspb.ExtensionFieldBinaryInfo(\n"
      "    $class$.$name$,\n"
      "    $binaryReaderFn$,\n"
      "    $binaryWriterFn$,\n"
      "    $binaryMessageSerializeFn$,\n"
      "    $binaryMessageDeserializeFn$,\n",
      "extendName",
      JSExtensionsObjectName(options, field->file(), field->containing_type()),
      "index", StrCat(field->number()), "class", extension_scope, "name",
      extension_object_name, "binaryReaderFn",
      JSBinaryReaderMethodName(options, field), "binaryWriterFn",
      JSBinaryWriterMethodName(options, field), "binaryMessageSerializeFn",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE)
          ? (SubmessageTypeRef(options, field) + ".serializeBinaryToWriter")
          : "undefined",
      "binaryMessageDeserializeFn",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE)
          ? (SubmessageTypeRef(options, field) + ".deserializeBinaryFromReader")
          : "undefined");

  printer->Print("    $isPacked$);\n", "isPacked",
                 (field->is_packed() ? "true" : "false"));

  printer->Print(
      "// This registers the extension field with the extended class, so that\n"
      "// toObject() will function correctly.\n"
      "$extendName$[$index$] = $class$.$name$;\n"
      "\n",
      "extendName",
      JSExtensionsObjectName(options, field->file(), field->containing_type()),
      "index", StrCat(field->number()), "class", extension_scope, "name",
      extension_object_name);
}